

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::cmServerBase(cmServerBase *this,cmConnection *connection)

{
  int iVar1;
  int err;
  cmConnection *connection_local;
  cmServerBase *this_local;
  
  this->_vptr_cmServerBase = (_func_int **)&PTR__cmServerBase_009b94e0;
  ::cm::shared_mutex::shared_mutex(&this->ConnectionsMutex);
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::vector(&this->Connections);
  this->ServeThreadRunning = false;
  ::cm::uv_async_ptr::uv_async_ptr(&this->ShutdownSignal);
  this->ServeThreadId = 0;
  ::cm::uv_signal_ptr::uv_signal_ptr(&this->SIGINTHandler);
  ::cm::uv_signal_ptr::uv_signal_ptr(&this->SIGHUPHandler);
  iVar1 = uv_loop_init(&this->Loop);
  (this->Loop).data = this;
  if (iVar1 == 0) {
    (*this->_vptr_cmServerBase[2])(this,connection);
    return;
  }
  __assert_fail("err == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                ,0x206,"cmServerBase::cmServerBase(cmConnection *)");
}

Assistant:

cmServerBase::cmServerBase(cmConnection* connection)
{
  auto err = uv_loop_init(&Loop);
  (void)err;
  Loop.data = this;
  assert(err == 0);

  AddNewConnection(connection);
}